

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * tinyusdz::print_typed_attr<bool>
                   (string *__return_storage_ptr__,TypedAttributeWithFallback<bool> *attr,
                   string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Path *v;
  bool bVar2;
  ostream *poVar3;
  pointer pPVar4;
  long lVar5;
  uint32_t uVar6;
  pointer pPVar7;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  stringstream ss;
  string local_208;
  string *local_1e8;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pPVar7 = (pointer)(ulong)indent;
  local_1e8 = name;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((((attr->_empty == false) && ((attr->_attrib).has_value_ == false)) &&
      ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start)) && (attr->_blocked != true)) goto LAB_00182737;
  bVar2 = AttrMetas::authored(&attr->_metas);
  if ((bVar2) || (attr->_blocked != false)) {
LAB_001823f0:
    uVar6 = (uint32_t)pPVar7;
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)indent,n);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    paVar1 = &local_208.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                               local_208.field_2._M_allocated_capacity._0_4_) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"uniform ",8);
    local_208.field_2._M_allocated_capacity._0_4_ = 0x6c6f6f62;
    local_208._M_string_length = 4;
    local_208.field_2._M_allocated_capacity._4_4_ =
         local_208.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    local_208._M_dataplus._M_p = (pointer)paVar1;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(local_1e8->_M_dataplus)._M_p,local_1e8->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                               local_208.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if (attr->_blocked == true) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = None",7);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
      std::ostream::_M_insert<bool>(SUB81(local_1a8,0));
    }
    bVar2 = AttrMetas::authored(&attr->_metas);
    if (bVar2) {
      local_1e0 = __return_storage_ptr__;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
      print_attr_metas_abi_cxx11_(&local_208,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),uVar6)
      ;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n_00);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      __return_storage_ptr__ = local_1e0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                                 local_208.field_2._M_allocated_capacity._0_4_) + 1);
        __return_storage_ptr__ = local_1e0;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    pPVar4 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar7 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar6 = extraout_EDX;
  }
  else {
    pPVar4 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar7 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((pPVar7 == pPVar4) || (uVar6 = n, (attr->_empty & 1U) == 0)) goto LAB_001823f0;
  }
  if (pPVar7 != pPVar4) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)indent,uVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    paVar1 = &local_208.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                               local_208.field_2._M_allocated_capacity._0_4_) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"uniform ",8);
    local_208.field_2._M_allocated_capacity._0_4_ = 0x6c6f6f62;
    local_208._M_string_length = 4;
    local_208.field_2._M_allocated_capacity._4_4_ =
         local_208.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    local_208._M_dataplus._M_p = (pointer)paVar1;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(local_1e8->_M_dataplus)._M_p,local_1e8->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT44(local_208.field_2._M_allocated_capacity._4_4_,
                               local_208.field_2._M_allocated_capacity._0_4_) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start;
    lVar5 = ((long)(attr->_paths).
                   super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar5 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar5 == 1) {
      std::operator<<(local_1a8,v);
    }
    else {
      std::operator<<(local_1a8,&attr->_paths);
    }
  }
LAB_00182737:
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttributeWithFallback<T> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    // default
    if (attr.metas().authored() || attr.is_blocked() || (!attr.is_connection())) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else {
        ss << " = " << attr.get_value();
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
    }
  }

  return ss.str();
}